

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

Own<capnp::ClientHook,_std::nullptr_t> __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcPipeline::getPipelinedCap
          (RpcPipeline *this,ArrayPtr<const_capnp::PipelineOp> ops)

{
  PipelineOp *pPVar1;
  size_t sVar2;
  long lVar3;
  Entry *pEVar4;
  size_t in_RCX;
  ClientHook *extraout_RDX;
  ClientHook *extraout_RDX_00;
  ClientHook *pCVar5;
  Own<capnp::ClientHook,_std::nullptr_t> OVar6;
  ArrayBuilder<capnp::PipelineOp> copy;
  Array<capnp::PipelineOp> result;
  PipelineOp *pPStack_70;
  Array<capnp::PipelineOp> local_58;
  anon_class_16_2_633b9ddf local_40;
  StringPtr local_30;
  
  local_58.ptr = (PipelineOp *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (8,0,in_RCX,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  pPStack_70 = local_58.ptr;
  if (in_RCX != 0) {
    lVar3 = 0;
    do {
      *pPStack_70 = *(PipelineOp *)(ops.size_ + lVar3);
      pPStack_70 = pPStack_70 + 1;
      lVar3 = lVar3 + 8;
    } while (in_RCX << 3 != lVar3);
  }
  local_58.size_ = (long)pPStack_70 - (long)local_58.ptr >> 3;
  local_40.ops = &local_58;
  local_58.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_40.this = (RpcPipeline *)ops.ptr;
  local_30.content.ptr = (char *)local_58.ptr;
  local_30.content.size_ = local_58.size_;
  pEVar4 = kj::
           Table<kj::HashMap<kj::Array<capnp::PipelineOp>,kj::Own<capnp::ClientHook,decltype(nullptr)>>::Entry,kj::HashIndex<kj::HashMap<kj::Array<capnp::PipelineOp>,kj::Own<capnp::ClientHook,decltype(nullptr)>>::Callbacks>>
           ::
           FindOrCreateImpl<capnp::_::RpcSystemBase::RpcConnectionState::RpcPipeline::getPipelinedCap(kj::Array<capnp::PipelineOp>&&)::{lambda()#1},kj::ArrayPtr<capnp::PipelineOp>&>
           ::apply<0ul>(&(((RpcPipeline *)ops.ptr)->clientMap).table,&local_30,&local_40);
  (*((pEVar4->value).ptr)->_vptr_ClientHook[4])(this);
  sVar2 = local_58.size_;
  pPVar1 = local_58.ptr;
  pCVar5 = extraout_RDX;
  if (local_58.ptr != (PipelineOp *)0x0) {
    local_58.ptr = (PipelineOp *)0x0;
    local_58.size_ = 0;
    (**(local_58.disposer)->_vptr_ArrayDisposer)(local_58.disposer,pPVar1,8,sVar2,sVar2);
    pCVar5 = extraout_RDX_00;
  }
  OVar6.ptr = pCVar5;
  OVar6.disposer = (Disposer *)this;
  return OVar6;
}

Assistant:

kj::Own<ClientHook> getPipelinedCap(kj::ArrayPtr<const PipelineOp> ops) override {
      auto copy = kj::heapArrayBuilder<PipelineOp>(ops.size());
      for (auto& op: ops) {
        copy.add(op);
      }
      return getPipelinedCap(copy.finish());
    }